

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O2

bool tchecker::dbm::is_universal(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  uint __line;
  long lVar2;
  ulong uVar3;
  char *__assertion;
  clock_id_t j;
  ulong uVar4;
  
  if (dbm == (db_t *)0x0) {
    __assertion = "dbm != nullptr";
    __line = 100;
  }
  else {
    if (dim != 0) {
      uVar1 = (ulong)dim;
      lVar2 = 0;
      uVar3 = 0;
      while ((uVar3 != uVar1 && (dbm[(int)uVar3 * dim + (int)uVar3] == (db_t)0x1))) {
        for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
          if ((uVar3 != uVar4) && (dbm[(uint)((int)lVar2 + (int)uVar4)] != (db_t)0x7ffffffe))
          goto LAB_00170eb7;
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + uVar1;
      }
LAB_00170eb7:
      return uVar1 <= uVar3;
    }
    __assertion = "dim >= 1";
    __line = 0x65;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,__line,
                "bool tchecker::dbm::is_universal(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

bool is_universal(tchecker::dbm::db_t const * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  // <inf everywhere except <=0 on diagonal
  for (tchecker::clock_id_t i = 0; i < dim; ++i) {
    if (DBM(i, i) != tchecker::dbm::LE_ZERO)
      return false;

    for (tchecker::clock_id_t j = 0; j < dim; ++j) {
      if ((i != j) && (DBM(i, j) != tchecker::dbm::LT_INFINITY))
        return false;
    }
  }
  return true;
}